

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::arraySizeCheck
          (TParseContext *this,TSourceLoc *loc,TIntermTyped *expr,TArraySize *sizePair,
          char *sizeType,bool isTypeParameter)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  long *plVar4;
  long lVar5;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  uint uVar6;
  char *pcVar7;
  
  sizePair->node = (TIntermTyped *)0x0;
  iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[5])(expr);
  if (CONCAT44(extraout_var,iVar3) == 0) {
    iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x21])(expr);
    if ((*(byte *)(CONCAT44(extraout_var_00,iVar3) + 0xc) & 1) == 0) {
      iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[7])(expr);
      uVar6 = 1;
      if ((CONCAT44(extraout_var_01,iVar3) != 0) &&
         (iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[7])(expr),
         *(int *)(CONCAT44(extraout_var_02,iVar3) + 0xb8) == 0x1ee)) {
        iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[7])(expr);
        plVar4 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar3) + 0x188))
                                   ((long *)CONCAT44(extraout_var_03,iVar3));
        lVar5 = (**(code **)(*plVar4 + 0xf0))(plVar4);
        if ((*(byte *)(lVar5 + 10) & 0x20) != 0) {
          iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[7])(expr);
          sizePair->node = (TIntermTyped *)CONCAT44(extraout_var_05,iVar3);
          goto LAB_0041a5b8;
        }
      }
      bVar1 = false;
    }
    else {
      sizePair->node = expr;
      iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0xc])(expr);
      bVar2 = true;
      uVar6 = 1;
      bVar1 = true;
      if (((CONCAT44(extraout_var_04,iVar3) != 0) &&
          (lVar5 = *(long *)(CONCAT44(extraout_var_04,iVar3) + 0x128), bVar1 = bVar2, lVar5 != 0))
         && (0 < (int)((ulong)(*(long *)(lVar5 + 0x10) - (long)*(uint **)(lVar5 + 8)) >> 4))) {
        uVar6 = **(uint **)(lVar5 + 8);
      }
    }
  }
  else {
    uVar6 = **(uint **)(*(long *)(CONCAT44(extraout_var,iVar3) + 0xc0) + 8);
LAB_0041a5b8:
    bVar1 = true;
  }
  sizePair->size = uVar6;
  if (isTypeParameter) {
    iVar3 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                      (this,"GL_NV_cooperative_matrix2");
    if ((char)iVar3 == '\0') {
      pcVar7 = "must be a constant integer expression";
      if ((!bVar1) ||
         ((iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x20])(expr), iVar3 != 8 &&
          (iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x20])(expr), iVar3 != 9))))
      goto LAB_0041a78b;
    }
    else {
      pcVar7 = "must be a constant integer or boolean expression";
      if ((!bVar1) ||
         (((iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x20])(expr), iVar3 != 8 &&
           (iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x20])(expr), iVar3 != 9)) &&
          (iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x20])(expr), iVar3 != 0xc))))
      goto LAB_0041a78b;
    }
    if (-1 < (int)uVar6) {
      return;
    }
    pcVar7 = "must be a non-negative integer";
  }
  else {
    pcVar7 = "must be a constant integer expression";
    if ((bVar1) &&
       ((iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x20])(expr), iVar3 == 8 ||
        (iVar3 = (*(expr->super_TIntermNode)._vptr_TIntermNode[0x20])(expr), iVar3 == 9)))) {
      if (0 < (int)uVar6) {
        return;
      }
      pcVar7 = "must be a positive integer";
    }
  }
LAB_0041a78b:
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  (*UNRECOVERED_JUMPTABLE)(this,loc,sizeType,"",pcVar7,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void TParseContext::arraySizeCheck(const TSourceLoc& loc, TIntermTyped* expr, TArraySize& sizePair,
                                   const char* sizeType, const bool isTypeParameter)
{
    bool isConst = false;
    sizePair.node = nullptr;

    int size = 1;

    TIntermConstantUnion* constant = expr->getAsConstantUnion();
    if (constant) {
        // handle true (non-specialization) constant
        size = constant->getConstArray()[0].getIConst();
        isConst = true;
    } else {
        // see if it's a specialization constant instead
        if (expr->getQualifier().isSpecConstant()) {
            isConst = true;
            sizePair.node = expr;
            TIntermSymbol* symbol = expr->getAsSymbolNode();
            if (symbol && symbol->getConstArray().size() > 0)
                size = symbol->getConstArray()[0].getIConst();
        } else if (expr->getAsUnaryNode() && expr->getAsUnaryNode()->getOp() == glslang::EOpArrayLength &&
                   expr->getAsUnaryNode()->getOperand()->getType().isCoopMatNV()) {
            isConst = true;
            size = 1;
            sizePair.node = expr->getAsUnaryNode();
        }
    }

    sizePair.size = size;

    if (isTypeParameter) {
        if (extensionTurnedOn(E_GL_NV_cooperative_matrix2)) {
            if (! isConst || (expr->getBasicType() != EbtInt && expr->getBasicType() != EbtUint && expr->getBasicType() != EbtBool)) {
                error(loc, sizeType, "", "must be a constant integer or boolean expression");
                return;
            }
        } else {
            if (! isConst || (expr->getBasicType() != EbtInt && expr->getBasicType() != EbtUint)) {
                error(loc, sizeType, "", "must be a constant integer expression");
                return;
            }
        }
        if (size < 0) {
            error(loc, sizeType, "", "must be a non-negative integer");
            return;
        }
    } else {
        if (! isConst || (expr->getBasicType() != EbtInt && expr->getBasicType() != EbtUint)) {
            error(loc, sizeType, "", "must be a constant integer expression");
            return;
        }
        if (size <= 0) {
            error(loc, sizeType, "", "must be a positive integer");
            return;
        }
    }
}